

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::applyParams
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandedDecl *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Reader subSource)

{
  BrandScope *params_00;
  undefined1 local_e8 [16];
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_d8;
  BrandedDecl local_c0;
  
  if ((this->body).tag == 2) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    params_00 = (this->brand).ptr;
    local_d8.ptr = params->ptr;
    local_d8.size_ = params->size_;
    local_d8.disposer = params->disposer;
    params->ptr = (BrandedDecl *)0x0;
    params->size_ = 0;
    BrandScope::setParams
              ((BrandScope *)local_e8,
               (Array<capnp::compiler::NodeTranslator::BrandedDecl> *)params_00,(Which)&local_d8,
               subSource);
    if ((BrandScope *)local_e8._8_8_ == (BrandScope *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      BrandedDecl(&local_c0,this);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=
                (&local_c0.brand,(Own<capnp::compiler::NodeTranslator::BrandScope> *)local_e8);
      local_c0.source._reader.dataSize = subSource._reader.dataSize;
      local_c0.source._reader.pointerCount = subSource._reader.pointerCount;
      local_c0.source._reader._38_2_ = subSource._reader._38_2_;
      local_c0.source._reader.nestingLimit = subSource._reader.nestingLimit;
      local_c0.source._reader._44_4_ = subSource._reader._44_4_;
      local_c0.source._reader.data = subSource._reader.data;
      local_c0.source._reader.pointers = subSource._reader.pointers;
      local_c0.source._reader.segment = subSource._reader.segment;
      local_c0.source._reader.capTable = subSource._reader.capTable;
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                (&__return_storage_ptr__->ptr,&local_c0);
      ~BrandedDecl(&local_c0);
    }
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose
              ((Own<capnp::compiler::NodeTranslator::BrandScope> *)local_e8);
    kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array(&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandedDecl::applyParams(
    kj::Array<BrandedDecl> params, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return nullptr;
  } else {
    return brand->setParams(kj::mv(params), body.get<Resolver::ResolvedDecl>().kind, subSource)
        .map([&](kj::Own<BrandScope>&& scope) {
      BrandedDecl result = *this;
      result.brand = kj::mv(scope);
      result.source = subSource;
      return result;
    });
  }
}